

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O2

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  int _d;
  uint _c;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [12];
  unsigned_short uVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  int i;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  undefined8 *puVar21;
  undefined4 *puVar22;
  long lVar23;
  ulong uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  iVar13 = (this->super_Cast).type_from;
  iVar14 = (this->super_Cast).type_to;
  if (iVar13 == iVar14) {
    iVar13 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar14 = bottom_blob->w;
      iVar11 = bottom_blob->h;
      iVar2 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar14;
      top_blob->h = iVar11;
      top_blob->d = iVar2;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar11 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    _d = bottom_blob->d;
    _c = bottom_blob->c;
    iVar9 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar18 = (size_t)_elempack;
    switch(iVar14) {
    case 1:
      if (iVar13 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar18 = sVar18 * 4;
      break;
    case 2:
    case 4:
      sVar18 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar18 = bottom_blob->elemsize;
    }
    switch(iVar9) {
    case 1:
      Mat::create(top_blob,iVar11,sVar18,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar11,iVar2,sVar18,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar11,iVar2,_c,sVar18,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar11,iVar2,_d,_c,sVar18,_elempack,opt->blob_allocator);
    }
    iVar13 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar14 = (this->super_Cast).type_from;
      iVar9 = (this->super_Cast).type_to;
      if (iVar9 == 2 && iVar14 == 1) {
        iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar24 = 0;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        uVar19 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar19 = 0;
        }
        for (; uVar24 != uVar19; uVar24 = uVar24 + 1) {
          sVar18 = bottom_blob->cstep;
          sVar4 = top_blob->cstep;
          sVar5 = bottom_blob->elemsize;
          pvVar10 = bottom_blob->data;
          sVar6 = top_blob->elemsize;
          pvVar15 = top_blob->data;
          for (lVar23 = 0; iVar13 != (int)lVar23; lVar23 = lVar23 + 1) {
            uVar8 = float32_to_float16(*(float *)((long)pvVar10 +
                                                 lVar23 * 4 + sVar18 * sVar5 * uVar24));
            *(unsigned_short *)((long)pvVar15 + lVar23 * 2 + sVar4 * sVar6 * uVar24) = uVar8;
          }
        }
        iVar14 = (this->super_Cast).type_from;
        iVar9 = (this->super_Cast).type_to;
      }
      if (iVar9 == 1 && iVar14 == 2) {
        iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar24 = 0;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        uVar16 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar16 = uVar24;
        }
        for (; uVar24 != uVar16; uVar24 = uVar24 + 1) {
          sVar18 = bottom_blob->cstep;
          sVar4 = top_blob->cstep;
          sVar5 = bottom_blob->elemsize;
          pvVar10 = bottom_blob->data;
          sVar6 = top_blob->elemsize;
          pvVar15 = top_blob->data;
          for (lVar23 = 0; iVar13 != (int)lVar23; lVar23 = lVar23 + 1) {
            fVar25 = float16_to_float32(*(unsigned_short *)
                                         ((long)pvVar10 + lVar23 * 2 + sVar18 * sVar5 * uVar24));
            *(float *)((long)pvVar15 + lVar23 * 4 + sVar4 * sVar6 * uVar24) = fVar25;
          }
        }
        iVar14 = (this->super_Cast).type_from;
        iVar9 = (this->super_Cast).type_to;
      }
      if ((iVar14 == 3) && (iVar9 == 1)) {
        uVar19 = _d * _elempack * iVar2 * iVar11;
        pvVar10 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        pvVar15 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        uVar16 = 0;
        uVar24 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar24 = uVar16;
        }
        uVar12 = (ulong)_c;
        if ((int)_c < 1) {
          uVar12 = uVar16;
        }
        sVar6 = bottom_blob->elemsize;
        for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
          for (uVar17 = 0; uVar24 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar15 + uVar17 * 4) = (float)(int)*(char *)((long)pvVar10 + uVar17);
          }
          pvVar15 = (void *)((long)pvVar15 + sVar4 * sVar5);
          pvVar10 = (void *)((long)pvVar10 + sVar18 * sVar6);
        }
        iVar9 = (this->super_Cast).type_to;
      }
      if ((iVar14 == 1) && (iVar9 == 4)) {
        iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar16 = 0;
        uVar24 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar24 = uVar16;
        }
        for (; uVar16 != uVar24; uVar16 = uVar16 + 1) {
          pvVar10 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar4 = bottom_blob->cstep;
          pauVar20 = (undefined1 (*) [16])(sVar4 * uVar16 * sVar18 + (long)pvVar10);
          pvVar15 = top_blob->data;
          sVar5 = top_blob->elemsize;
          sVar6 = top_blob->cstep;
          puVar22 = (undefined4 *)(sVar6 * uVar16 * sVar5 + (long)pvVar15);
          lVar23 = 0;
          for (iVar14 = 0; iVar14 + 7 < iVar13; iVar14 = iVar14 + 8) {
            auVar26 = pshuflw(*pauVar20,*pauVar20,0xed);
            auVar26 = pshufhw(auVar26,auVar26,0xed);
            auVar27 = pshuflw(pauVar20[1],pauVar20[1],0xed);
            auVar27 = pshufhw(auVar27,auVar27,0xed);
            *puVar22 = auVar26._0_4_;
            puVar22[1] = auVar26._8_4_;
            puVar22[2] = auVar27._0_4_;
            puVar22[3] = auVar27._8_4_;
            pauVar20 = pauVar20 + 2;
            puVar22 = puVar22 + 4;
            lVar23 = lVar23 + 8;
          }
          for (; (int)lVar23 < iVar13; lVar23 = lVar23 + 1) {
            *(undefined2 *)((long)pvVar15 + lVar23 * 2 + sVar6 * sVar5 * uVar16) =
                 *(undefined2 *)((long)pvVar10 + lVar23 * 4 + sVar4 * sVar18 * uVar16 + 2);
          }
        }
        iVar14 = (this->super_Cast).type_from;
        iVar9 = (this->super_Cast).type_to;
      }
      iVar13 = 0;
      if ((iVar14 == 4) && (iVar9 == 1)) {
        iVar14 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        iVar13 = 0;
        uVar24 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar24 = 0;
        }
        for (uVar16 = 0; uVar16 != uVar24; uVar16 = uVar16 + 1) {
          pvVar10 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar4 = bottom_blob->cstep;
          puVar21 = (undefined8 *)(sVar4 * uVar16 * sVar18 + (long)pvVar10);
          pvVar15 = top_blob->data;
          sVar5 = top_blob->elemsize;
          sVar6 = top_blob->cstep;
          pauVar20 = (undefined1 (*) [16])(sVar6 * uVar16 * sVar5 + (long)pvVar15);
          lVar23 = 0;
          for (iVar11 = 0; iVar11 + 3 < iVar14; iVar11 = iVar11 + 4) {
            uVar1 = *puVar21;
            auVar7._10_2_ = (short)((ulong)uVar1 >> 0x20);
            auVar7._0_10_ = (unkuint10)0;
            auVar26._2_12_ =
                 SUB1612(ZEXT616(CONCAT42(auVar7._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
            auVar26._0_2_ = (short)uVar1;
            auVar26._14_2_ = 0;
            *pauVar20 = auVar26 << 0x10;
            puVar21 = puVar21 + 1;
            pauVar20 = pauVar20 + 1;
            lVar23 = lVar23 + 4;
          }
          for (; (int)lVar23 < iVar14; lVar23 = lVar23 + 1) {
            *(uint *)((long)pvVar15 + lVar23 * 4 + sVar6 * sVar5 * uVar16) =
                 (uint)*(ushort *)((long)pvVar10 + lVar23 * 2 + sVar4 * sVar18 * uVar16) << 0x10;
          }
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}